

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::
TestFactoryImpl<google::protobuf::(anonymous_namespace)::UnknownFieldSetTest_SpaceUsed_Test>::
CreateTest(TestFactoryImpl<google::protobuf::(anonymous_namespace)::UnknownFieldSetTest_SpaceUsed_Test>
           *this)

{
  UnknownFieldSetTest *this_00;
  
  this_00 = (UnknownFieldSetTest *)operator_new(0x398);
  google::protobuf::UnknownFieldSetTest::UnknownFieldSetTest(this_00);
  (this_00->super_Test)._vptr_Test = (_func_int **)&PTR__UnknownFieldSetTest_0163f4c8;
  return &this_00->super_Test;
}

Assistant:

Test* CreateTest() override { return new TestClass; }